

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_ec_keyx.c
# Opt level: O2

int pkey_gost_encrypt(EVP_PKEY_CTX *pctx,uchar *out,size_t *out_len,uchar *key,size_t key_len)

{
  bool bVar1;
  uchar *puVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  void *pvVar6;
  EVP_PKEY *pEVar7;
  ASN1_OBJECT *pAVar8;
  gost_cipher_info *pgVar9;
  EVP_PKEY *pkey;
  BIGNUM *pBVar10;
  EC_KEY *pEVar11;
  EC_POINT *pEVar12;
  EC_KEY *pEVar13;
  uchar *out_00;
  PSKeyTransport_gost *a;
  ASN1_OCTET_STRING *str;
  GOST_KEY_TRANSPORT *a_00;
  int function;
  EVP_PKEY *local_1138;
  EVP_PKEY *local_1130;
  int local_1120;
  int local_111c;
  gost_cipher_info *local_1118;
  uchar ukm [8];
  uchar *local_1100;
  uchar *local_10f8;
  uchar *local_10f0;
  uchar shared_key [32];
  uchar crypted_key [44];
  gost_ctx cctx;
  
  pvVar6 = EVP_PKEY_CTX_get_data((EVP_PKEY_CTX *)pctx);
  iVar4 = *(int *)((long)pvVar6 + 0x3c);
  if (iVar4 != 0) {
    if ((iVar4 == 0x4a4) || (iVar4 == 0x3f5)) {
      crypted_key._0_8_ = out;
      pEVar7 = EVP_PKEY_CTX_get0_pkey((EVP_PKEY_CTX *)pctx);
      pvVar6 = EVP_PKEY_CTX_get_data((EVP_PKEY_CTX *)pctx);
      iVar4 = EVP_PKEY_get_base_id(pEVar7);
      if (*(int *)((long)pvVar6 + 0x3c) == 0x4a4) {
        local_1118 = (gost_cipher_info *)0x4;
        iVar3 = 8;
        local_1120 = 0x4a8;
      }
      else {
        if (*(int *)((long)pvVar6 + 0x3c) != 0x3f5) {
          function = 0x97;
          iVar3 = 0x86;
          iVar4 = 0x1bb;
          goto LAB_0011c0fb;
        }
        local_1118 = (gost_cipher_info *)0x8;
        iVar3 = 0x10;
        local_1120 = 0x3f9;
      }
      shared_key._0_4_ = iVar3 + (int)key_len;
      out_00 = (uchar *)CRYPTO_malloc(shared_key._0_4_,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/gost_ec_keyx.c"
                                      ,0x1c0);
      if (out_00 == (uchar *)0x0) {
        function = 0x97;
        iVar3 = 0xc0100;
        iVar4 = 0x1c2;
        goto LAB_0011c0fb;
      }
      local_1130 = EVP_PKEY_CTX_get0_peerkey((EVP_PKEY_CTX *)pctx);
      if (local_1130 == (EVP_PKEY *)0x0) {
        local_1130 = EVP_PKEY_new();
        if (local_1130 == (EVP_PKEY *)0x0) {
          ERR_GOST_error(0x97,0xc0100,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/gost_ec_keyx.c"
                         ,0x1cb);
          local_1130 = (EVP_PKEY *)0x0;
        }
        else {
          iVar3 = EVP_PKEY_get_base_id(pEVar7);
          pEVar11 = EC_KEY_new();
          iVar3 = EVP_PKEY_assign(local_1130,iVar3,pEVar11);
          if ((iVar3 != 0) && (iVar3 = EVP_PKEY_copy_parameters(local_1130,pEVar7), iVar3 != 0)) {
            pEVar13 = (EC_KEY *)EVP_PKEY_get0(local_1130);
            iVar3 = gost_ec_keygen(pEVar13);
            if (iVar3 != 0) {
              bVar1 = true;
              goto LAB_0011bf3f;
            }
          }
          ERR_GOST_error(0x97,0x69,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/gost_ec_keyx.c"
                         ,0x1d3);
        }
        a = (PSKeyTransport_gost *)0x0;
        iVar4 = 0;
        bVar1 = false;
        goto LAB_0011c5a1;
      }
      bVar1 = false;
LAB_0011bf3f:
      if (*(long *)((long)pvVar6 + 0x30) == 0) {
        iVar3 = RAND_bytes((uchar *)((long)pvVar6 + 0x10),0x20);
        if (0 < iVar3) {
          *(undefined8 *)((long)pvVar6 + 0x30) = 0x20;
          goto LAB_0011bf62;
        }
        iVar3 = 0xc0103;
        iVar4 = 0x1db;
      }
      else {
LAB_0011bf62:
        local_10f8 = out;
        pEVar11 = (EC_KEY *)EVP_PKEY_get0(pEVar7);
        pEVar12 = EC_KEY_get0_public_key(pEVar11);
        pEVar13 = (EC_KEY *)EVP_PKEY_get0(local_1130);
        local_10f0 = (uchar *)((long)pvVar6 + 0x10);
        iVar4 = gost_keg((uchar *)((long)pvVar6 + 0x10),iVar4,(EC_POINT *)pEVar12,pEVar13,
                         (uchar *)&cctx);
        if (0 < iVar4) {
          iVar4 = gost_kexp15(key,(int)key_len,*(int *)((long)pvVar6 + 0x3c),(uchar *)cctx.key,
                              local_1120,(uchar *)&cctx,(uchar *)((long)pvVar6 + 0x28),
                              (size_t)local_1118,out_00,(int *)shared_key);
          if (iVar4 < 1) {
            iVar3 = 0x66;
            iVar4 = 0x1ec;
LAB_0011c45f:
            ERR_GOST_error(0x97,iVar3,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/gost_ec_keyx.c"
                           ,iVar4);
            a = (PSKeyTransport_gost *)0x0;
          }
          else {
            a = PSKeyTransport_gost_new();
            if (a == (PSKeyTransport_gost *)0x0) {
              iVar3 = 0xc0100;
              iVar4 = 0x1f2;
              goto LAB_0011c45f;
            }
            str = ASN1_OCTET_STRING_new();
            a->ukm = (ASN1_OCTET_STRING *)str;
            if (str == (ASN1_OCTET_STRING *)0x0) {
              iVar3 = 0xc0100;
              iVar4 = 0x1f8;
            }
            else {
              iVar4 = ASN1_OCTET_STRING_set(str,local_10f0,*(int *)((long)pvVar6 + 0x30));
              if (iVar4 == 0) {
                iVar3 = 0xc0100;
                iVar4 = 0x1fd;
              }
              else {
                iVar4 = ASN1_OCTET_STRING_set((ASN1_OCTET_STRING *)a->psexp,out_00,shared_key._0_4_)
                ;
                puVar2 = local_10f8;
                if (iVar4 == 0) {
                  iVar3 = 0xc0100;
                  iVar4 = 0x202;
                }
                else {
                  if (local_10f8 != (uchar *)0x0) {
                    pEVar7 = local_1130;
                  }
                  iVar4 = X509_PUBKEY_set((X509_PUBKEY **)&a->ephem_key,pEVar7);
                  if (iVar4 == 0) {
                    iVar3 = 0x66;
                    iVar4 = 0x207;
                  }
                  else {
                    iVar4 = 0;
                    uVar5 = i2d_PSKeyTransport_gost(a,(uchar **)0x0);
                    if ((int)uVar5 < 1) {
                      ERR_GOST_error(0x97,0x8000d,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/gost_ec_keyx.c"
                                     ,0x20d);
                      goto LAB_0011c5a1;
                    }
                    iVar4 = 1;
                    if (puVar2 == (uchar *)0x0) {
                      *out_len = (ulong)uVar5;
                      goto LAB_0011c5a1;
                    }
                    if (*out_len < (ulong)uVar5) {
                      iVar3 = 0x8c;
                      iVar4 = 0x216;
                    }
                    else {
                      iVar3 = i2d_PSKeyTransport_gost(a,(uchar **)crypted_key);
                      *out_len = (long)iVar3;
                      if (iVar3 != 0) goto LAB_0011c5a1;
                      iVar3 = 0x8000d;
                      iVar4 = 0x21c;
                    }
                  }
                }
              }
            }
            ERR_GOST_error(0x97,iVar3,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/gost_ec_keyx.c"
                           ,iVar4);
          }
          iVar4 = 0;
          goto LAB_0011c5a1;
        }
        iVar3 = 0x87;
        iVar4 = 0x1e5;
      }
      ERR_GOST_error(0x97,iVar3,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/gost_ec_keyx.c"
                     ,iVar4);
      a = (PSKeyTransport_gost *)0x0;
      iVar4 = 0;
LAB_0011c5a1:
      OPENSSL_cleanse(&cctx,0x40);
      if (bVar1) {
        EVP_PKEY_free(local_1130);
      }
      PSKeyTransport_gost_free(a);
      CRYPTO_free(out_00);
      return iVar4;
    }
    if (iVar4 != 0x32d) {
      function = 0x98;
      iVar3 = 0xc0103;
      iVar4 = 0x238;
LAB_0011c0fb:
      ERR_GOST_error(function,iVar3,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/gost_ec_keyx.c"
                     ,iVar4);
      return -1;
    }
  }
  local_1100 = out;
  pEVar7 = EVP_PKEY_CTX_get0_pkey((EVP_PKEY_CTX *)pctx);
  pvVar6 = EVP_PKEY_CTX_get_data((EVP_PKEY_CTX *)pctx);
  iVar3 = EVP_PKEY_get_base_id(pEVar7);
  iVar4 = 0x3eb;
  if (iVar3 == 0x32b) {
    iVar4 = 0x338;
  }
  if (iVar3 == 0x331) {
    iVar4 = 0x338;
  }
  pAVar8 = OBJ_nid2obj(iVar4);
  pgVar9 = get_encryption_params((ASN1_OBJECT *)pAVar8);
  pkey = EVP_PKEY_CTX_get0_peerkey((EVP_PKEY_CTX *)pctx);
  if (*(long *)((long)pvVar6 + 0x30) == 0) {
    iVar4 = RAND_bytes(ukm,8);
    if (iVar4 < 1) {
      ERR_GOST_error(0x7c,0x7e,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/gost_ec_keyx.c"
                     ,0x12d);
      return 0;
    }
  }
  else {
    ukm = *(uchar (*) [8])((long)pvVar6 + 0x10);
  }
  if (pgVar9 == (gost_cipher_info *)0x0) {
    a_00 = (GOST_KEY_TRANSPORT *)0x0;
LAB_0011c0dd:
    bVar1 = true;
    local_1138 = pkey;
    goto LAB_0011c39d;
  }
  if (pkey == (EVP_PKEY *)0x0) {
    if (out != (uchar *)0x0) {
      local_1118 = pgVar9;
      local_1138 = EVP_PKEY_new();
      iVar4 = EVP_PKEY_get_base_id(pEVar7);
      pEVar11 = EC_KEY_new();
      iVar4 = EVP_PKEY_assign(local_1138,iVar4,pEVar11);
      if ((iVar4 != 0) && (iVar4 = EVP_PKEY_copy_parameters(local_1138,pEVar7), iVar4 != 0)) {
        pEVar13 = (EC_KEY *)EVP_PKEY_get0(local_1138);
        iVar4 = gost_ec_keygen(pEVar13);
        if (iVar4 != 0) {
          bVar1 = true;
          pgVar9 = local_1118;
          goto LAB_0011be43;
        }
      }
      ERR_GOST_error(0x7c,0x69,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/gost_ec_keyx.c"
                     ,0x143);
      bVar1 = true;
      a_00 = (GOST_KEY_TRANSPORT *)0x0;
      goto LAB_0011c39d;
    }
    bVar1 = true;
    local_1138 = (EVP_PKEY *)0x0;
    goto LAB_0011c28b;
  }
  pBVar10 = gost_get0_priv_key((EVP_PKEY *)pkey);
  local_1138 = pkey;
  if (pBVar10 == (BIGNUM *)0x0) {
    ERR_GOST_error(0x7c,0x7c,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/gost_ec_keyx.c"
                   ,0x138);
    a_00 = (GOST_KEY_TRANSPORT *)0x0;
    bVar1 = false;
    goto LAB_0011c39d;
  }
  bVar1 = false;
  if (out == (uchar *)0x0) {
LAB_0011c28b:
    a_00 = GOST_KEY_TRANSPORT_new();
    if (a_00 != (GOST_KEY_TRANSPORT *)0x0) {
      iVar4 = ASN1_OCTET_STRING_set((ASN1_OCTET_STRING *)a_00->key_agreement_info->eph_iv,ukm,8);
      if (((iVar4 == 0) ||
          (iVar4 = ASN1_OCTET_STRING_set
                             ((ASN1_OCTET_STRING *)a_00->key_info->imit,crypted_key + 0x28,4),
          iVar4 == 0)) ||
         (iVar4 = ASN1_OCTET_STRING_set
                            ((ASN1_OCTET_STRING *)a_00->key_info->encrypted_key,crypted_key + 8,0x20
                            ), iVar4 == 0)) goto LAB_0011c39d;
      if (pkey == (EVP_PKEY *)0x0) {
        if (out != (uchar *)0x0) {
          pEVar7 = local_1138;
        }
        iVar4 = X509_PUBKEY_set((X509_PUBKEY **)&a_00->key_agreement_info->ephem_key,pEVar7);
        if (iVar4 == 0) {
          ERR_GOST_error(0x7c,0x66,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/gost_ec_keyx.c"
                         ,0x16a);
          pkey = local_1138;
          goto LAB_0011c0dd;
        }
        ASN1_OBJECT_free((ASN1_OBJECT *)a_00->key_agreement_info->cipher);
        pAVar8 = OBJ_nid2obj(pgVar9->nid);
        a_00->key_agreement_info->cipher = (ASN1_OBJECT *)pAVar8;
        EVP_PKEY_free(local_1138);
      }
      else {
        ASN1_OBJECT_free((ASN1_OBJECT *)a_00->key_agreement_info->cipher);
        pAVar8 = OBJ_nid2obj(pgVar9->nid);
        a_00->key_agreement_info->cipher = (ASN1_OBJECT *)pAVar8;
        iVar4 = EVP_PKEY_CTX_ctrl((EVP_PKEY_CTX *)pctx,-1,-1,2,3,(void *)0x0);
        if (iVar4 < 1) {
          ERR_GOST_error(0x7c,0x68,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/gost_ec_keyx.c"
                         ,0x176);
          bVar1 = false;
          goto LAB_0011c39d;
        }
      }
      uVar5 = i2d_GOST_KEY_TRANSPORT(a_00,(uchar **)0x0);
      if (0 < (int)uVar5) {
        if (local_1100 == (uchar *)0x0) {
          *out_len = (ulong)uVar5;
        }
        else {
          if (*out_len < (ulong)uVar5) {
            iVar3 = 0x8c;
            iVar4 = 0x185;
            goto LAB_0011c531;
          }
          iVar4 = i2d_GOST_KEY_TRANSPORT(a_00,&local_1100);
          *out_len = (long)iVar4;
          if (iVar4 == 0) {
            ERR_GOST_error(0x7c,0x8000d,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/gost_ec_keyx.c"
                           ,0x18b);
            iVar4 = 0;
            goto LAB_0011c5f7;
          }
        }
        iVar4 = 1;
LAB_0011c5f7:
        OPENSSL_cleanse(shared_key,0x20);
        GOST_KEY_TRANSPORT_free(a_00);
        return iVar4;
      }
      iVar3 = 0x8000d;
      iVar4 = 0x17c;
LAB_0011c531:
      ERR_GOST_error(0x7c,iVar3,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/gost_ec_keyx.c"
                     ,iVar4);
      goto LAB_0011c39d;
    }
  }
  else {
LAB_0011be43:
    local_111c = 0;
    EVP_PKEY_get_default_digest_nid(pEVar7,&local_111c);
    if (local_111c == 0x3d7) {
      local_111c = 0x3d6;
    }
    pEVar11 = (EC_KEY *)EVP_PKEY_get0(pEVar7);
    pEVar12 = EC_KEY_get0_public_key(pEVar11);
    pEVar13 = (EC_KEY *)EVP_PKEY_get0(local_1138);
    iVar4 = VKO_compute_key(shared_key,(EC_POINT *)pEVar12,pEVar13,ukm,8,local_111c);
    if (iVar4 != 0) {
      gost_init(&cctx,pgVar9->sblock);
      keyWrapCryptoPro(&cctx,shared_key,ukm,key,crypted_key);
      goto LAB_0011c28b;
    }
    ERR_GOST_error(0x7c,0x69,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/gost_ec_keyx.c"
                   ,0x152);
  }
  a_00 = (GOST_KEY_TRANSPORT *)0x0;
LAB_0011c39d:
  OPENSSL_cleanse(shared_key,0x20);
  if (bVar1) {
    EVP_PKEY_free(local_1138);
  }
  GOST_KEY_TRANSPORT_free(a_00);
  return -1;
}

Assistant:

int pkey_gost_encrypt(EVP_PKEY_CTX *pctx, unsigned char *out,
                      size_t *out_len, const unsigned char *key, size_t key_len)
{
  struct gost_pmeth_data *gctx = EVP_PKEY_CTX_get_data(pctx);
  switch (gctx->cipher_nid)
  {
    case NID_id_Gost28147_89:
    case NID_undef: /* FIXME */
      return pkey_GOST_ECcp_encrypt(pctx, out, out_len, key, key_len);
      break;
    case NID_kuznyechik_ctr:
    case NID_magma_ctr:
      return pkey_gost2018_encrypt(pctx, out, out_len, key, key_len);
      break;
    default:
      GOSTerr(GOST_F_PKEY_GOST_ENCRYPT, ERR_R_INTERNAL_ERROR);
      return -1;
  }
}